

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
mxx::scatter<int>(vector<int,_std::allocator<int>_> *__return_storage_ptr__,
                 vector<int,_std::allocator<int>_> *msgs,int root,comm *comm)

{
  ulong uVar1;
  size_t size;
  ulong local_30;
  
  uVar1 = (long)(msgs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(msgs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start >> 2;
  local_30 = uVar1 / (ulong)(long)comm->m_size;
  if ((comm->m_rank == 0) && (uVar1 % (ulong)(long)comm->m_size != 0)) {
    assert_fail("comm.rank() != 0 || msgs.size() % (size_t)comm.size() == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/collective.hpp"
                ,199,"scatter");
  }
  bcast<unsigned_long>(&local_30,root,comm);
  scatter<int>(__return_storage_ptr__,msgs,local_30,root,comm);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> scatter(const std::vector<T>& msgs, int root, const mxx::comm& comm = mxx::comm()) {
    size_t size = msgs.size() / comm.size();
    MXX_ASSERT(comm.rank() != 0 || msgs.size() % (size_t)comm.size() == 0);
    mxx::bcast(size, root, comm);
    // now everybody knows the size
    std::vector<T> result = scatter(msgs, size, root, comm);
    return result;
}